

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O1

void __thiscall QSystemTrayIconPrivate::install_sys(QSystemTrayIconPrivate *this)

{
  QSystemTrayIcon *trayIcon;
  QSystemTrayWatcher *this_00;
  long *plVar1;
  undefined8 uVar2;
  long lVar3;
  QSystemTrayIconSys *this_01;
  long in_FS_OFFSET;
  QArrayData *local_40;
  char *local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->qpa_sys == (QPlatformSystemTrayIcon *)0x0) {
    if (this->sys == (QSystemTrayIconSys *)0x0) {
      trayIcon = *(QSystemTrayIcon **)&this->field_0x8;
      if (this->trayWatcher == (QSystemTrayWatcher *)0x0) {
        this_00 = (QSystemTrayWatcher *)operator_new(0x18);
        QSystemTrayWatcher::QSystemTrayWatcher((QSystemTrayWatcher *)this_00,trayIcon);
        this->trayWatcher = this_00;
      }
      plVar1 = (long *)QGuiApplication::platformNativeInterface();
      local_40 = (QArrayData *)0x0;
      local_38 = "traywindow";
      local_30 = 10;
      uVar2 = QGuiApplication::primaryScreen();
      lVar3 = (**(code **)(*plVar1 + 0x70))(plVar1,&local_40,uVar2);
      if (local_40 != (QArrayData *)0x0) {
        LOCK();
        (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_40,1,0x10);
        }
      }
      if (lVar3 != 0) {
        this_01 = (QSystemTrayIconSys *)operator_new(0x30);
        QSystemTrayIconSys::QSystemTrayIconSys((QSystemTrayIconSys *)this_01,trayIcon);
        this->sys = this_01;
        QWidget::show((QWidget *)this_01);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    install_sys_qpa(this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIconPrivate::install_sys()
{
    Q_Q(QSystemTrayIcon);

    if (qpa_sys) {
        install_sys_qpa();
        return;
    }

    if (!sys) {
        if (!trayWatcher)
            trayWatcher = new QSystemTrayWatcher(q);

        if (locateSystemTray()) {
            sys = new QSystemTrayIconSys(q);
            sys->show();
        }
    }
}